

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_layer_metas_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,LayerMetas *metas,uint32_t indent)

{
  string *psVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  bool v;
  uint32_t n;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  Axis v_00;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t extraout_EDX_11;
  uint32_t extraout_EDX_12;
  uint32_t extraout_EDX_13;
  uint32_t extraout_EDX_14;
  uint32_t extraout_EDX_15;
  uint32_t extraout_EDX_16;
  uint32_t extraout_EDX_17;
  uint32_t extraout_EDX_18;
  uint32_t extraout_EDX_19;
  uint32_t extraout_EDX_20;
  uint32_t extraout_EDX_21;
  uint32_t extraout_EDX_22;
  uint32_t extraout_EDX_23;
  uint32_t extraout_EDX_24;
  uint32_t extraout_EDX_25;
  uint32_t extraout_EDX_26;
  uint32_t extraout_EDX_27;
  uint32_t extraout_EDX_28;
  uint32_t extraout_EDX_29;
  uint32_t n_00;
  StringData *v_01;
  StringData *v_02;
  pprint *this_00;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream meta_ss;
  string local_268;
  string local_248;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  uint local_204;
  string *local_200;
  string local_1f8;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  this_00 = (pprint *)((ulong)metas & 0xffffffff);
  local_200 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  n_00 = n;
  if (*(long *)(this + 0xe10) != 0) {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"doc = ",6);
    to_string_abi_cxx11_(&local_248,this + 0xe08,v_01);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_248._M_dataplus._M_p,local_248._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    n_00 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_01;
    }
  }
  if ((((this[0x488] != (tinyusdz)0x0) || (this[0x478] != (tinyusdz)0x0)) ||
      (*(long *)(this + 0x468) != *(long *)(this + 0x460))) || (this[0x498] == (tinyusdz)0x1)) {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"metersPerUnit = ",0x10);
    poVar2 = ::std::ostream::_M_insert<double>
                       (*(double *)(this + (ulong)(((byte)this[0x478] ^ 1) << 4) + 0x480));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    n_00 = extraout_EDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_03;
    }
  }
  if (((this[0x1068] != (tinyusdz)0x0) || (this[0x1058] != (tinyusdz)0x0)) ||
     ((*(long *)(this + 0x1048) != *(long *)(this + 0x1040) || (this[0x1078] == (tinyusdz)0x1)))) {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"kilogramsPerUnit = ",0x13);
    poVar2 = ::std::ostream::_M_insert<double>
                       (*(double *)(this + (ulong)(((byte)this[0x1058] ^ 1) << 4) + 0x1060));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    n_00 = extraout_EDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_05;
    }
  }
  if (((this[0x228] != (tinyusdz)0x0) || (this[0x220] != (tinyusdz)0x0)) ||
     ((*(long *)(this + 0x210) != *(long *)(this + 0x208) || (this[0x230] == (tinyusdz)0x1)))) {
    local_204 = (uint)metas;
    pprint::Indent_abi_cxx11_(&local_248,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"upAxis = ",9);
    to_string_abi_cxx11_
              (&local_1f8,
               (tinyusdz *)(ulong)*(uint *)(this + (ulong)((byte)this[0x220] ^ 1) * 8 + 0x224),v_00)
    ;
    local_1d8 = local_1c8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\"","");
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,local_1d8,local_1d0 + (long)local_1d8);
    ::std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_1f8._M_dataplus._M_p);
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_1d8);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_218 = *plVar5;
      lStack_210 = plVar3[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar5;
      local_228 = (long *)*plVar3;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)local_228,local_220);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    this_00 = (pprint *)(ulong)local_204;
    n_00 = extraout_EDX_06;
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
      n_00 = extraout_EDX_07;
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
      n_00 = extraout_EDX_08;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_09;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_10;
    }
  }
  if ((((this[0x6d0] != (tinyusdz)0x0) || (this[0x6c0] != (tinyusdz)0x0)) ||
      (*(long *)(this + 0x6b0) != *(long *)(this + 0x6a8))) || (this[0x6e0] == (tinyusdz)0x1)) {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"timeCodesPerSecond = ",0x15);
    poVar2 = ::std::ostream::_M_insert<double>
                       (*(double *)(this + (ulong)(((byte)this[0x6c0] ^ 1) << 4) + 0x6c8));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    n_00 = extraout_EDX_11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_12;
    }
  }
  if (((this[0xb60] != (tinyusdz)0x0) || (this[0xb50] != (tinyusdz)0x0)) ||
     ((*(long *)(this + 0xb40) != *(long *)(this + 0xb38) || (this[0xb70] == (tinyusdz)0x1)))) {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"startTimeCode = ",0x10);
    poVar2 = ::std::ostream::_M_insert<double>
                       (*(double *)(this + (ulong)(((byte)this[0xb50] ^ 1) << 4) + 0xb58));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    n_00 = extraout_EDX_13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_14;
    }
  }
  if (((this[0xda8] != (tinyusdz)0x0) || (this[0xd98] != (tinyusdz)0x0)) ||
     ((*(long *)(this + 0xd88) != *(long *)(this + 0xd80) || (this[0xdb8] == (tinyusdz)0x1)))) {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"endTimeCode = ",0xe);
    poVar2 = ::std::ostream::_M_insert<double>
                       (*(double *)(this + (ulong)(((byte)this[0xd98] ^ 1) << 4) + 0xda0));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    n_00 = extraout_EDX_15;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_16;
    }
  }
  if ((((this[0x918] != (tinyusdz)0x0) || (this[0x908] != (tinyusdz)0x0)) ||
      (*(long *)(this + 0x8f8) != *(long *)(this + 0x8f0))) || (this[0x928] == (tinyusdz)0x1)) {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"framesPerSecond = ",0x12);
    poVar2 = ::std::ostream::_M_insert<double>
                       (*(double *)(this + (ulong)(((byte)this[0x908] ^ 1) << 4) + 0x910));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    n_00 = extraout_EDX_17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_18;
    }
  }
  if (*(long *)(this + 0xdc8) != *(long *)(this + 0xdc0)) {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"subLayers = ",0xc);
    poVar2 = ::std::operator<<(poVar2,(vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>
                                       *)(this + 0xdc0));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    n_00 = extraout_EDX_19;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_20;
    }
  }
  if (*(long *)(this + 0x240) != 0) {
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)0x1,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"defaultPrim = ",0xe);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\"","");
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,local_1f8._M_dataplus._M_p,
               local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
    ::std::__cxx11::string::_M_append((char *)&local_268,*(ulong *)(this + 0x238));
    plVar3 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_268,(ulong)local_1f8._M_dataplus._M_p);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_218 = *plVar5;
      lStack_210 = plVar3[3];
      local_228 = &local_218;
    }
    else {
      local_218 = *plVar5;
      local_228 = (long *)*plVar3;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)local_228,local_220);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    n_00 = extraout_EDX_21;
    if (local_228 != &local_218) {
      operator_delete(local_228,local_218 + 1);
      n_00 = extraout_EDX_22;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_23;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_24;
    }
  }
  if (((this[0x12d2] != (tinyusdz)0x0) || (this[0x12d0] != (tinyusdz)0x0)) ||
     ((*(long *)(this + 0x12c0) != *(long *)(this + 0x12b8) || (this[0x12d4] == (tinyusdz)0x1)))) {
    pprint::Indent_abi_cxx11_(&local_268,(pprint *)0x1,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"autoPlay = ",0xb);
    to_string_abi_cxx11_
              (&local_248,
               (tinyusdz *)(ulong)(byte)this[(ulong)((byte)this[0x12d0] ^ 1) * 2 + 0x12d1],v);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_248._M_dataplus._M_p,local_248._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    n_00 = extraout_EDX_25;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_26;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      n_00 = extraout_EDX_27;
    }
  }
  if (this[0x1500] == (tinyusdz)0x0) {
    if (((byte)this[0x14f8] & 1) != 0) goto LAB_002d3c71;
    lVar4 = 0x22c;
    if ((*(long *)(this + 0x14e8) == *(long *)(this + 0x14e0)) && (this[0x1508] == (tinyusdz)0x0))
    goto LAB_002d3d11;
  }
  else {
    lVar4 = 0x22c;
    if (((byte)this[0x14f8] & 1) != 0) {
LAB_002d3c71:
      lVar4 = 0x224;
    }
  }
  if (*(int *)(this + lVar4 + 0x12d8) == 1) {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    pcVar6 = "playbackMode = \"loop\"\n";
  }
  else {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    pcVar6 = "playbackMode = \"none\"\n";
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,0x16);
  n_00 = extraout_EDX_28;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    n_00 = extraout_EDX_29;
  }
LAB_002d3d11:
  if (*(long *)(this + 0xde0) != 0) {
    pprint::Indent_abi_cxx11_(&local_268,this_00,n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    to_string_abi_cxx11_(&local_248,this + 0xdd8,v_02);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_248._M_dataplus._M_p,local_248._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(this + 0x10a8) != 0) {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"customLayerData","");
    print_customData(&local_268,(CustomDataType *)(this + 0x1080),&local_248,1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  psVar1 = local_200;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string print_layer_metas(const LayerMetas &metas, const uint32_t indent) {
  std::stringstream meta_ss;

  if (metas.doc.value.empty()) {
    // ss << pprint::Indent(1) << "doc = \"Exporterd from TinyUSDZ v" <<
    // tinyusdz::version_major
    //    << "." << tinyusdz::version_minor << "." << tinyusdz::version_micro
    //    << tinyusdz::version_rev << "\"\n";
  } else {
    meta_ss << pprint::Indent(indent) << "doc = " << to_string(metas.doc)
            << "\n";
  }

  if (metas.metersPerUnit.authored()) {
    meta_ss << pprint::Indent(indent)
            << "metersPerUnit = " << metas.metersPerUnit.get_value() << "\n";
  }

  if (metas.kilogramsPerUnit.authored()) {
    meta_ss << pprint::Indent(indent)
            << "kilogramsPerUnit = " << metas.kilogramsPerUnit.get_value() << "\n";
  }

  if (metas.upAxis.authored()) {
    meta_ss << pprint::Indent(indent)
            << "upAxis = " << quote(to_string(metas.upAxis.get_value()))
            << "\n";
  }

  if (metas.timeCodesPerSecond.authored()) {
    meta_ss << pprint::Indent(indent)
            << "timeCodesPerSecond = " << metas.timeCodesPerSecond.get_value()
            << "\n";
  }

  if (metas.startTimeCode.authored()) {
    meta_ss << pprint::Indent(indent)
            << "startTimeCode = " << metas.startTimeCode.get_value() << "\n";
  }

  if (metas.endTimeCode.authored()) {
    meta_ss << pprint::Indent(indent)
            << "endTimeCode = " << metas.endTimeCode.get_value() << "\n";
  }

  if (metas.framesPerSecond.authored()) {
    meta_ss << pprint::Indent(indent)
            << "framesPerSecond = " << metas.framesPerSecond.get_value()
            << "\n";
  }

  // TODO: Do not print subLayers when consumed(after composition evaluated)
  if (metas.subLayers.size()) {
    meta_ss << pprint::Indent(indent) << "subLayers = " << metas.subLayers
            << "\n";
  }

  if (metas.defaultPrim.str().size()) {
    meta_ss << pprint::Indent(1)
            << "defaultPrim = " << tinyusdz::quote(metas.defaultPrim.str())
            << "\n";
  }

  if (metas.autoPlay.authored()) {
    meta_ss << pprint::Indent(1)
            << "autoPlay = " << to_string(metas.autoPlay.get_value()) << "\n";
  }

  if (metas.playbackMode.authored()) {
    auto v = metas.playbackMode.get_value();
    if (v == LayerMetas::PlaybackMode::PlaybackModeLoop) {
      meta_ss << pprint::Indent(indent) << "playbackMode = \"loop\"\n";
    } else {  // None
      meta_ss << pprint::Indent(indent) << "playbackMode = \"none\"\n";
    }
  }

  if (!metas.comment.value.empty()) {
    // Stage meta omits 'comment'
    meta_ss << pprint::Indent(indent) << to_string(metas.comment) << "\n";
  }

  if (metas.customLayerData.size()) {
    meta_ss << print_customData(metas.customLayerData, "customLayerData",
                                /* indent */ 1);
  }

  return meta_ss.str();
}